

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O1

int Curl_getaddrinfo_ex(char *nodename,char *servname,addrinfo *hints,Curl_addrinfo **result)

{
  int iVar1;
  Curl_addrinfo *pCVar2;
  sockaddr *__dest;
  char *pcVar3;
  addrinfo *paVar4;
  Curl_addrinfo *pCVar5;
  size_t __n;
  Curl_addrinfo *pCVar6;
  bool bVar7;
  addrinfo *aihead;
  addrinfo *local_38;
  
  *result = (Curl_addrinfo *)0x0;
  iVar1 = getaddrinfo(nodename,servname,(addrinfo *)hints,&local_38);
  if (iVar1 == 0) {
    bVar7 = local_38 == (addrinfo *)0x0;
    if (bVar7) {
      pCVar6 = (Curl_addrinfo *)0x0;
      iVar1 = 0;
    }
    else {
      pCVar5 = (Curl_addrinfo *)0x0;
      pCVar6 = (Curl_addrinfo *)0x0;
      paVar4 = local_38;
      do {
        pCVar2 = pCVar5;
        if (paVar4->ai_family == 2) {
          __n = 0x10;
LAB_0013ba68:
          if ((paVar4->ai_addr != (sockaddr *)0x0) && ((uint)__n <= paVar4->ai_addrlen)) {
            pCVar2 = (Curl_addrinfo *)(*Curl_cmalloc)(0x30);
            if (pCVar2 != (Curl_addrinfo *)0x0) {
              pCVar2->ai_flags = paVar4->ai_flags;
              pCVar2->ai_family = paVar4->ai_family;
              pCVar2->ai_socktype = paVar4->ai_socktype;
              pCVar2->ai_protocol = paVar4->ai_protocol;
              pCVar2->ai_addrlen = (uint)__n;
              pCVar2->ai_canonname = (char *)0x0;
              pCVar2->ai_addr = (sockaddr *)0x0;
              pCVar2->ai_next = (Curl_addrinfo *)0x0;
              __dest = (sockaddr *)(*Curl_cmalloc)(__n);
              pCVar2->ai_addr = __dest;
              if (__dest != (sockaddr *)0x0) {
                memcpy(__dest,paVar4->ai_addr,__n);
                if (paVar4->ai_canonname != (char *)0x0) {
                  pcVar3 = (*Curl_cstrdup)(paVar4->ai_canonname);
                  pCVar2->ai_canonname = pcVar3;
                  if (pcVar3 == (char *)0x0) {
                    (*Curl_cfree)(pCVar2->ai_addr);
                    goto LAB_0013bb4c;
                  }
                }
                if (pCVar6 == (Curl_addrinfo *)0x0) {
                  pCVar6 = pCVar2;
                }
                if (pCVar5 != (Curl_addrinfo *)0x0) {
                  pCVar5->ai_next = pCVar2;
                }
                goto LAB_0013ba78;
              }
LAB_0013bb4c:
              (*Curl_cfree)(pCVar2);
            }
            iVar1 = -10;
            goto LAB_0013bb67;
          }
        }
        else if (paVar4->ai_family == 10) {
          __n = 0x1c;
          goto LAB_0013ba68;
        }
LAB_0013ba78:
        pCVar5 = pCVar2;
        paVar4 = paVar4->ai_next;
        bVar7 = paVar4 == (addrinfo *)0x0;
      } while (!bVar7);
      iVar1 = 0;
    }
LAB_0013bb67:
    if (local_38 != (addrinfo *)0x0) {
      freeaddrinfo(local_38);
    }
    if (bVar7) {
      iVar1 = (uint)(pCVar6 != (Curl_addrinfo *)0x0) * 2 + -2;
    }
    else {
      while (pCVar6 != (Curl_addrinfo *)0x0) {
        (*Curl_cfree)(pCVar6->ai_addr);
        (*Curl_cfree)(pCVar6->ai_canonname);
        pCVar5 = pCVar6->ai_next;
        (*Curl_cfree)(pCVar6);
        pCVar6 = pCVar5;
      }
      pCVar6 = (Curl_addrinfo *)0x0;
    }
    *result = pCVar6;
  }
  return iVar1;
}

Assistant:

int
Curl_getaddrinfo_ex(const char *nodename,
                    const char *servname,
                    const struct addrinfo *hints,
                    Curl_addrinfo **result)
{
  const struct addrinfo *ai;
  struct addrinfo *aihead;
  Curl_addrinfo *cafirst = NULL;
  Curl_addrinfo *calast = NULL;
  Curl_addrinfo *ca;
  size_t ss_size;
  int error;

  *result = NULL; /* assume failure */

  error = getaddrinfo(nodename, servname, hints, &aihead);
  if(error)
    return error;

  /* traverse the addrinfo list */

  for(ai = aihead; ai != NULL; ai = ai->ai_next) {

    /* ignore elements with unsupported address family, */
    /* settle family-specific sockaddr structure size.  */
    if(ai->ai_family == AF_INET)
      ss_size = sizeof(struct sockaddr_in);
#ifdef ENABLE_IPV6
    else if(ai->ai_family == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
#endif
    else
      continue;

    /* ignore elements without required address info */
    if((ai->ai_addr == NULL) || !(ai->ai_addrlen > 0))
      continue;

    /* ignore elements with bogus address size */
    if((size_t)ai->ai_addrlen < ss_size)
      continue;

    if((ca = malloc(sizeof(Curl_addrinfo))) == NULL) {
      error = EAI_MEMORY;
      break;
    }

    /* copy each structure member individually, member ordering, */
    /* size, or padding might be different for each platform.    */

    ca->ai_flags     = ai->ai_flags;
    ca->ai_family    = ai->ai_family;
    ca->ai_socktype  = ai->ai_socktype;
    ca->ai_protocol  = ai->ai_protocol;
    ca->ai_addrlen   = (curl_socklen_t)ss_size;
    ca->ai_addr      = NULL;
    ca->ai_canonname = NULL;
    ca->ai_next      = NULL;

    if((ca->ai_addr = malloc(ss_size)) == NULL) {
      error = EAI_MEMORY;
      free(ca);
      break;
    }
    memcpy(ca->ai_addr, ai->ai_addr, ss_size);

    if(ai->ai_canonname != NULL) {
      if((ca->ai_canonname = strdup(ai->ai_canonname)) == NULL) {
        error = EAI_MEMORY;
        free(ca->ai_addr);
        free(ca);
        break;
      }
    }

    /* if the return list is empty, this becomes the first element */
    if(!cafirst)
      cafirst = ca;

    /* add this element last in the return list */
    if(calast)
      calast->ai_next = ca;
    calast = ca;

  }

  /* destroy the addrinfo list */
  if(aihead)
    freeaddrinfo(aihead);

  /* if we failed, also destroy the Curl_addrinfo list */
  if(error) {
    Curl_freeaddrinfo(cafirst);
    cafirst = NULL;
  }
  else if(!cafirst) {
#ifdef EAI_NONAME
    /* rfc3493 conformant */
    error = EAI_NONAME;
#else
    /* rfc3493 obsoleted */
    error = EAI_NODATA;
#endif
#ifdef USE_WINSOCK
    SET_SOCKERRNO(error);
#endif
  }

  *result = cafirst;

  /* This is not a CURLcode */
  return error;
}